

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void QMetaObjectPrivate::memberIndexes
               (QObject *obj,QMetaMethod *member,int *signalIndex,int *methodIndex)

{
  long lVar1;
  int iVar2;
  MethodType MVar3;
  QMetaObject *this;
  QMetaObject *in_RCX;
  int *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *m;
  int methodOffset;
  int signalOffset;
  QMetaMethod *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = -1;
  *(undefined4 *)&(in_RCX->d).superdata.direct = 0xffffffff;
  if ((in_RDI != (undefined8 *)0x0) && (*in_RSI != 0)) {
    this = (QMetaObject *)(**(code **)*in_RDI)();
    while( true ) {
      uVar4 = false;
      if (this != (QMetaObject *)0x0) {
        uVar4 = this != (QMetaObject *)*in_RSI;
      }
      if ((bool)uVar4 == false) break;
      this = QMetaObject::SuperData::operator_cast_to_QMetaObject_((SuperData *)this);
    }
    if (this != (QMetaObject *)0x0) {
      iVar2 = QMetaMethod::relativeMethodIndex(in_stack_ffffffffffffffb8);
      *(int *)&(in_RCX->d).superdata.direct = iVar2;
      *in_RDX = iVar2;
      computeOffsets(in_RCX,(int *)this,(int *)CONCAT17(uVar4,in_stack_ffffffffffffffc0));
      *(int *)&(in_RCX->d).superdata.direct = *(int *)&(in_RCX->d).superdata.direct + -0x55555556;
      MVar3 = QMetaMethod::methodType(in_stack_ffffffffffffffb8);
      if (MVar3 == Signal) {
        iVar2 = originalClone((QMetaObject *)in_stack_ffffffffffffffb8,0);
        *in_RDX = iVar2;
        *in_RDX = *in_RDX + -0x55555556;
      }
      else {
        *in_RDX = -1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMetaObjectPrivate::memberIndexes(const QObject *obj,
                                       const QMetaMethod &member,
                                       int *signalIndex, int *methodIndex)
{
    *signalIndex = -1;
    *methodIndex = -1;
    if (!obj || !member.mobj)
        return;
    const QMetaObject *m = obj->metaObject();
    // Check that member is member of obj class
    while (m != nullptr && m != member.mobj)
        m = m->d.superdata;
    if (!m)
        return;
    *signalIndex = *methodIndex = member.relativeMethodIndex();

    int signalOffset;
    int methodOffset;
    computeOffsets(m, &signalOffset, &methodOffset);

    *methodIndex += methodOffset;
    if (member.methodType() == QMetaMethod::Signal) {
        *signalIndex = originalClone(m, *signalIndex);
        *signalIndex += signalOffset;
    } else {
        *signalIndex = -1;
    }
}